

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_mount.c
# Opt level: O0

LY_ERR schema_mount_parse(lysp_ctx *pctx,lysp_ext_instance *ext)

{
  LY_ERR LVar1;
  lysp_module *plVar2;
  lysp_ext_instance *ext_local;
  lysp_ctx *pctx_local;
  
  plVar2 = lyplg_ext_parse_get_cur_pmod(pctx);
  if (plVar2->version == '\x02') {
    if ((ext->parent_stmt == LY_STMT_CONTAINER) || (ext->parent_stmt == LY_STMT_LIST)) {
      LVar1 = schema_mount_parse_unique_mp(pctx,ext);
      if (LVar1 == LY_SUCCESS) {
        pctx_local._4_4_ = LY_SUCCESS;
      }
      else {
        pctx_local._4_4_ = LY_EINVAL;
      }
    }
    else {
      lyplg_ext_parse_log(pctx,ext,LY_LLERR,LY_EVALID,
                          "Extension \"%s\" instance allowed only in container or list statement.",
                          ext->name);
      pctx_local._4_4_ = LY_EINVAL;
    }
  }
  else {
    lyplg_ext_parse_log(pctx,ext,LY_LLERR,LY_EVALID,
                        "Extension \"%s\" instance not allowed in YANG version 1 module.",ext->name)
    ;
    pctx_local._4_4_ = LY_EINVAL;
  }
  return pctx_local._4_4_;
}

Assistant:

static LY_ERR
schema_mount_parse(struct lysp_ctx *pctx, struct lysp_ext_instance *ext)
{
    /* check YANG version 1.1 */
    if (lyplg_ext_parse_get_cur_pmod(pctx)->version != LYS_VERSION_1_1) {
        lyplg_ext_parse_log(pctx, ext, LY_LLERR, LY_EVALID, "Extension \"%s\" instance not allowed in YANG version 1 module.",
                ext->name);
        return LY_EINVAL;
    }

    /* check parent nodetype */
    if ((ext->parent_stmt != LY_STMT_CONTAINER) && (ext->parent_stmt != LY_STMT_LIST)) {
        lyplg_ext_parse_log(pctx, ext, LY_LLERR, LY_EVALID, "Extension \"%s\" instance allowed only in container or list statement.",
                ext->name);
        return LY_EINVAL;
    }

    /* check uniqueness */
    if (schema_mount_parse_unique_mp(pctx, ext)) {
        return LY_EINVAL;
    }

    /* nothing to actually parse */
    return LY_SUCCESS;
}